

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

UChar __thiscall icu_63::UCharCharacterIterator::next(UCharCharacterIterator *this)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  int iVar4;
  
  iVar1 = (this->super_CharacterIterator).pos;
  iVar4 = iVar1 + 1;
  iVar2 = (this->super_CharacterIterator).end;
  if (iVar4 < iVar2) {
    pcVar3 = this->text;
    (this->super_CharacterIterator).pos = iVar4;
    return pcVar3[(long)iVar1 + 1];
  }
  (this->super_CharacterIterator).pos = iVar2;
  return L'\xffff';
}

Assistant:

UChar
UCharCharacterIterator::next() {
    if (pos + 1 < end) {
        return text[++pos];
    } else {
        /* make current() return DONE */
        pos = end;
        return DONE;
    }
}